

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void __thiscall httplib::SSLClient::~SSLClient(SSLClient *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__SSLClient_0016f298;
  if ((SSL_CTX *)this->ctx_ != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)this->ctx_);
  }
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__Client_0016f260;
  pcVar1 = (this->super_Client).host_and_port_._M_dataplus._M_p;
  paVar2 = &(this->super_Client).host_and_port_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_Client).host_._M_dataplus._M_p;
  paVar2 = &(this->super_Client).host_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

inline SSLClient::~SSLClient()
{
    if (ctx_) {
        SSL_CTX_free(ctx_);
    }
}